

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BipartiteGraph.cpp
# Opt level: O3

vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
* __thiscall
BipartiteGraph::vertex_cover
          (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *__return_storage_ptr__,BipartiteGraph *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *Aindex,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *Bindex)

{
  int iVar1;
  size_type __n;
  pointer puVar2;
  unsigned_long uVar3;
  pointer pdVar4;
  long lVar5;
  pointer pvVar6;
  long lVar7;
  bool *pbVar8;
  pointer pVVar9;
  ulong uVar10;
  pointer pVVar11;
  ulong uVar12;
  long lVar13;
  pointer pdVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  double dVar18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> AScanList;
  vector<unsigned_long,_std::allocator<unsigned_long>_> BScanList;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ABflow;
  allocator_type local_119;
  long local_118;
  pointer local_110;
  pointer local_108;
  pointer local_100;
  pointer local_f8;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_f0;
  BipartiteGraph *local_e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_e0;
  vector<double,_std::allocator<double>_> local_d8;
  pointer local_c0;
  pointer local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_b0;
  pointer local_a8;
  long local_a0;
  value_type_conflict1 local_98;
  pointer local_90;
  pointer local_88;
  pointer local_80;
  pointer local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  pointer local_58;
  pointer local_50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  local_108 = (Aindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_110 = (Aindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  local_f8 = (Bindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_100 = (Bindex->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  __n = this->nA;
  local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0 = __return_storage_ptr__;
  local_e0 = Aindex;
  local_b0 = Bindex;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_d8,this->nB,(value_type_conflict *)&local_70,(allocator_type *)&local_98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_48,__n,&local_d8,&local_119);
  if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,this->n,
             (value_type_conflict1 *)&local_70,(allocator_type *)&local_98);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(local_f0,4,(value_type *)&local_d8,(allocator_type *)&local_119);
  if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,this->nA,
             (value_type_conflict1 *)&local_70,(allocator_type *)&local_98);
  local_98 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_70,this->nB,&local_98,(allocator_type *)&local_119);
  local_a0 = (long)local_110 - (long)local_108 >> 3;
  if (local_110 != local_108) {
    dVar17 = 0.0;
    lVar15 = 0;
    do {
      dVar17 = dVar17 + (this->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [(local_e0->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar15]].weight;
      lVar15 = lVar15 + 1;
    } while (local_a0 + (ulong)(local_a0 == 0) != lVar15);
    if (local_110 != local_108) {
      puVar2 = (local_e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pVVar11 = (this->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar15 = 0;
      do {
        uVar3 = puVar2[lVar15];
        pVVar11[uVar3].residual = pVVar11[uVar3].weight / dVar17;
        lVar15 = lVar15 + 1;
      } while (local_a0 + (ulong)(local_a0 == 0) != lVar15);
    }
  }
  lVar15 = (long)local_100 - (long)local_f8 >> 3;
  local_80 = (local_b0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
  if (local_100 != local_f8) {
    dVar17 = 0.0;
    lVar13 = 0;
    do {
      dVar17 = dVar17 + (this->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                        super__Vector_impl_data._M_start[local_80[lVar13]].weight;
      lVar13 = lVar13 + 1;
    } while (lVar15 + (ulong)(lVar15 == 0) != lVar13);
    if (local_100 != local_f8) {
      pVVar11 = (this->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar15 = lVar15 + (ulong)(lVar15 == 0);
      lVar13 = 0;
      do {
        pVVar11[local_80[lVar13]].residual = pVVar11[local_80[lVar13]].weight / dVar17;
        lVar13 = lVar13 + 1;
      } while (lVar15 != lVar13);
      local_80 = (local_b0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      goto LAB_00117062;
    }
  }
  lVar15 = lVar15 + (ulong)(lVar15 == 0);
LAB_00117062:
  local_88 = (local_e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
  local_90 = (this->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_b8 = (this->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_c0 = (local_f0->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_a0 = local_a0 + (ulong)(local_a0 == 0);
  local_58 = local_48.
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    lVar13 = 0;
    if (local_110 != local_108) {
      lVar7 = 0;
      do {
        uVar3 = local_88[lVar7];
        local_90[uVar3].label = -1.0;
        local_90[uVar3].pred = -1;
        lVar7 = lVar7 + 1;
      } while (local_a0 != lVar7);
    }
    if (local_100 != local_f8) {
      lVar7 = 0;
      pVVar11 = local_b8;
      do {
        uVar3 = local_80[lVar7];
        local_b8[uVar3].label = -1.0;
        local_b8[uVar3].pred = -1;
        pVVar11->label = -1.0;
        lVar7 = lVar7 + 1;
        pVVar11 = pVVar11 + 1;
      } while (lVar15 != lVar7);
    }
    if (local_110 == local_108) goto LAB_001175a1;
    local_118 = 0;
    lVar13 = 0;
    do {
      dVar18 = (double)local_88[lVar13];
      dVar17 = local_90[(long)dVar18].residual;
      if (dVar17 <= 0.0) {
        dVar17 = -1.0;
      }
      else {
        local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[local_118] = dVar18;
        local_118 = local_118 + 1;
      }
      local_90[(long)dVar18].label = dVar17;
      lVar13 = lVar13 + 1;
    } while (local_a0 != lVar13);
    if (local_118 == 0) break;
    local_78 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_a8 = (this->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
               super__Vector_impl_data._M_start;
LAB_001171c0:
    pdVar4 = (this->edge).
             super__Vector_base<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (local_b0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    lVar13 = 0;
    do {
      if (local_100 != local_f8) {
        local_50 = (this->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                   super__Vector_impl_data._M_start;
        pVVar11 = (this->Bvertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar16 = 0;
        do {
          dVar17 = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar13];
          uVar3 = puVar2[lVar16];
          lVar5 = (long)((iterator *)
                        ((long)&pdVar4[(long)dVar17].super__Deque_base<bool,_std::allocator<bool>_>.
                                _M_impl + 0x10))->_M_cur;
          uVar12 = (lVar5 - (long)*(_Elt_pointer *)
                                   ((long)&pdVar4[(long)dVar17].
                                           super__Deque_base<bool,_std::allocator<bool>_>._M_impl +
                                   0x18)) + uVar3;
          if ((long)uVar12 < 0) {
            uVar10 = (long)uVar12 >> 9;
LAB_00117251:
            pbVar8 = (*(_Map_pointer *)
                       ((long)&pdVar4[(long)dVar17].super__Deque_base<bool,_std::allocator<bool>_>.
                               _M_impl + 0x28))[uVar10] + uVar12 + uVar10 * -0x200;
          }
          else {
            if (0x1ff < uVar12) {
              uVar10 = uVar12 >> 9;
              goto LAB_00117251;
            }
            pbVar8 = (bool *)(lVar5 + uVar3);
          }
          if (*pbVar8 == true) {
            dVar18 = pVVar11[uVar3].label;
            if ((dVar18 == -1.0) && (!NAN(dVar18))) {
              pVVar9 = pVVar11 + uVar3;
              pVVar9->label = local_50[(long)dVar17].label;
              pVVar9->pred = SUB84(dVar17,0);
              local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar7] = uVar3;
              lVar7 = lVar7 + 1;
            }
          }
          lVar16 = lVar16 + 1;
        } while (lVar15 != lVar16);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != local_118);
    if (lVar7 == 0) break;
    puVar2 = (local_e0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->edge).
             super__Vector_base<std::deque<bool,_std::allocator<bool>_>,_std::allocator<std::deque<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_118 = 0;
    lVar13 = 0;
    while( true ) {
      uVar3 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13];
      dVar17 = local_a8[uVar3].residual;
      if (0.0 < dVar17) break;
      if (local_110 != local_108) {
        pVVar11 = (this->Avertex).super__Vector_base<Vertex,_std::allocator<Vertex>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar16 = 0;
        do {
          dVar17 = (double)puVar2[lVar16];
          uVar3 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start[lVar13];
          lVar5 = (long)((iterator *)
                        ((long)&pdVar4[(long)dVar17].super__Deque_base<bool,_std::allocator<bool>_>.
                                _M_impl + 0x10))->_M_cur;
          uVar12 = (lVar5 - (long)*(_Elt_pointer *)
                                   ((long)&pdVar4[(long)dVar17].
                                           super__Deque_base<bool,_std::allocator<bool>_>._M_impl +
                                   0x18)) + uVar3;
          if ((long)uVar12 < 0) {
            uVar10 = (long)uVar12 >> 9;
LAB_00117384:
            pbVar8 = (*(_Map_pointer *)
                       ((long)&pdVar4[(long)dVar17].super__Deque_base<bool,_std::allocator<bool>_>.
                               _M_impl + 0x28))[uVar10] + uVar12 + uVar10 * -0x200;
          }
          else {
            if (0x1ff < uVar12) {
              uVar10 = uVar12 >> 9;
              goto LAB_00117384;
            }
            pbVar8 = (bool *)(lVar5 + uVar3);
          }
          if (*pbVar8 == true) {
            dVar18 = pVVar11[(long)dVar17].label;
            if (((dVar18 == -1.0) && (!NAN(dVar18))) &&
               (dVar18 = local_48.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)dVar17].
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar3], 0.0 < dVar18)) {
              pVVar9 = pVVar11 + (long)dVar17;
              if (local_a8[uVar3].label <= dVar18) {
                dVar18 = local_a8[uVar3].label;
              }
              pVVar9->label = dVar18;
              pVVar9->pred = (int)uVar3;
              local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_118] = dVar17;
              local_118 = local_118 + 1;
            }
          }
          lVar16 = lVar16 + 1;
        } while (local_a0 != lVar16);
      }
      lVar13 = lVar13 + 1;
      if (lVar13 == lVar7) goto code_r0x0011740d;
    }
    pVVar11 = local_a8 + uVar3;
    dVar17 = (&pVVar11->label)[(ulong)(dVar17 < pVVar11->label || dVar17 == pVVar11->label) * 2];
    if (dVar17 <= 0.0) break;
    local_b8[uVar3].residual = local_b8[uVar3].residual - dVar17;
    lVar13 = (long)local_b8[uVar3].pred;
    pdVar14 = local_48.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar13].
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    pdVar14[uVar3] = pdVar14[uVar3] + dVar17;
    while (iVar1 = local_90[lVar13].pred, iVar1 != -1) {
      pdVar14[iVar1] = pdVar14[iVar1] - dVar17;
      lVar13 = (long)local_b8[iVar1].pred;
      pdVar14 = local_48.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar13].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar14[iVar1] = pdVar14[iVar1] + dVar17;
    }
    local_90[lVar13].residual = local_90[lVar13].residual - dVar17;
  }
LAB_0011751d:
  if (local_110 == local_108) {
    lVar13 = 0;
  }
  else {
    pvVar6 = (local_f0->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar13 = 0;
    lVar7 = 0;
    do {
      if ((local_90[local_88[lVar7]].label == -1.0) && (!NAN(local_90[local_88[lVar7]].label))) {
        *(unsigned_long *)
         (*(long *)&pvVar6[2].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data + lVar13 * 8) = local_88[lVar7];
        lVar13 = lVar13 + 1;
      }
      lVar7 = lVar7 + 1;
    } while (local_a0 != lVar7);
  }
LAB_001175a1:
  **(long **)&(local_c0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data = lVar13;
  if (local_100 == local_f8) {
    lVar13 = 0;
  }
  else {
    lVar13 = 0;
    lVar7 = 0;
    do {
      if (0.0 <= local_b8[local_80[lVar7]].label) {
        *(unsigned_long *)
         (*(long *)&local_c0[3].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data + lVar13 * 8) = local_80[lVar7];
        lVar13 = lVar13 + 1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar15 != lVar7);
  }
  **(long **)&local_c0[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data = lVar13;
  local_e8 = this;
  if (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  return local_f0;
code_r0x0011740d:
  if (local_118 == 0) goto LAB_0011751d;
  goto LAB_001171c0;
}

Assistant:

vector<vector<size_t>> BipartiteGraph::vertex_cover(const vector<size_t>& Aindex, const vector<size_t>& Bindex) {
    size_t nAVC = Aindex.size(), nBVC = Bindex.size(); //nAVC,nBVC=size of A and B
    double total = 0;
    vector<vector<double>> ABflow(nA, vector<double>(nB, 0.0));
    size_t i=0, j=0, k=0, AScanListSize=0, BScanListSize=0, augmentingPathEnd=0, Apathnode=0, Bpathnode=0;
    bool augmentingPathEndMINUS1 = true;
    vector<vector<size_t>> CD(4, vector<size_t>(this->n, 0)); //output: incidence vectors of vertex covers, CD[0]=Aside; CD[1]=Bside;
    vector<size_t> AScanList(nA, 0);
    vector<size_t> BScanList(nB, 0);

    /* First set normalized weights */
    total = 0;
    for (i = 0; i < nAVC; i++)
        total += this->Avertex[Aindex[i]].weight;
    for (i = 0; i < nAVC; i++)
        this->Avertex[Aindex[i]].residual = this->Avertex[Aindex[i]].weight / total;

    total = 0;
    for (j = 0; j < nBVC; j++)
        total += this->Bvertex[Bindex[j]].weight;
    for (j = 0; j < nBVC; j++)
        this->Bvertex[Bindex[j]].residual = this->Bvertex[Bindex[j]].weight / total;

    /* Now comes the flow algorithm
     * Flow on outside arcs are represented by Vertex[i].residual
     * Flow on inside arcs are represented by ABflow
     * Initialize ABflow to 0, start scanlist
     */

    total = 1; //flow augmentation in last stage
    while (total > 0) {
        //Scan Phase
        //Set labels
        total = 0;
        for (i = 0; i < nAVC; i++) {
            Avertex[Aindex[i]].label = -1;
            Avertex[Aindex[i]].pred = -1;
        }
        for (j = 0; j < nBVC; j++) {
            Bvertex[Bindex[j]].label = -1;
            Bvertex[Bindex[j]].pred = -1;
            Bvertex[j].label = -1;
        }
        AScanListSize = 0;
        for (i = 0; i < nAVC; i++) {
            if (Avertex[Aindex[i]].residual > 0) {
                Avertex[Aindex[i]].label = Avertex[Aindex[i]].residual;
                AScanList[AScanListSize] = Aindex[i];
                AScanListSize++;
            }
            else {
                Avertex[Aindex[i]].label = -1;
            }
        }
//        for (i = 0; i < nBVC; i++) {
//            Bvertex[i].label = -1;
//        }

        // scan for an augmenting path
        bool scanning = true;
        while (AScanListSize != 0 && scanning) {
            /* Scan the A side nodes*/
            BScanListSize = 0;
            for (i = 0; i < AScanListSize; i++) {
                for (j = 0; j < nBVC; j++) {
                    if (edge[AScanList[i]][Bindex[j]] && Bvertex[Bindex[j]].label == -1) {
                        Bvertex[Bindex[j]].label = Avertex[AScanList[i]].label;
                        Bvertex[Bindex[j]].pred = AScanList[i];
                        BScanList[BScanListSize] = Bindex[j];
                        BScanListSize++;
                    }
                }
            }
            /* Scan the B side nodes*/
            AScanListSize = 0;
            for (j = 0; j < BScanListSize; j++) {
                if (Bvertex[BScanList[j]].residual > 0) {
                    total = min(Bvertex[BScanList[j]].residual, Bvertex[BScanList[j]].label);
                    augmentingPathEnd = BScanList[j];
                    augmentingPathEndMINUS1 = false;
                    scanning = false;
                    break;
                } else {
                    for (i = 0; i < nAVC; i++) {
                        if (edge[Aindex[i]][BScanList[j]] && Avertex[Aindex[i]].label == -1 && ABflow[Aindex[i]][BScanList[j]] > 0) {
                            Avertex[Aindex[i]].label = min(Bvertex[BScanList[j]].label, ABflow[Aindex[i]][BScanList[j]]);
                            Avertex[Aindex[i]].pred = BScanList[j];
                            AScanList[AScanListSize] = Aindex[i];
                            AScanListSize++;
                        }
                    }
                }
            }
        }//scanning procedure

        if (total > 0) { // flow augmentation
            if (!augmentingPathEndMINUS1) {
                Bvertex[augmentingPathEnd].residual = Bvertex[augmentingPathEnd].residual - total;
                Bpathnode = augmentingPathEnd;
                Apathnode = Bvertex[Bpathnode].pred;

                ABflow[Apathnode][Bpathnode] = ABflow[Apathnode][Bpathnode] + total;
                while (Avertex[Apathnode].pred != -1) {
                    Bpathnode = Avertex[Apathnode].pred;
                    ABflow[Apathnode][Bpathnode] = ABflow[Apathnode][Bpathnode] - total;
                    Apathnode = Bvertex[Bpathnode].pred;
                    ABflow[Apathnode][Bpathnode] = ABflow[Apathnode][Bpathnode] + total;

                }
                Avertex[Apathnode].residual = Avertex[Apathnode].residual - total;
            }
        } else { //min vertex cover found, unlabeled A's, labeled B's
            k = 0;
            for (i = 0; i < nAVC; i++)
                if (Avertex[Aindex[i]].label == -1) {
                    CD[2][k] = Aindex[i];
                    k++;
                }
            CD[0][0] = k;
            k = 0;
            for (j = 0; j < nBVC; j++)
                if (Bvertex[Bindex[j]].label >= 0) {
                    CD[3][k] = Bindex[j];
                    k++;
                }
            CD[1][0] = k;
        }
    }//flow algorithm
    return CD;

}